

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

void __thiscall icu_63::Transliterator::Transliterator(Transliterator *this,Transliterator *other)

{
  UnicodeString *this_00;
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  __off_t __length;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Transliterator_0045f480;
  this_00 = &this->ID;
  icu_63::UnicodeString::UnicodeString(this_00,&other->ID);
  this->filter = (UnicodeFilter *)0x0;
  this->maximumContextLength = other->maximumContextLength;
  icu_63::UnicodeString::append(this_00,L'\0');
  sVar1 = (this->ID).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this->ID).fUnion.fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  icu_63::UnicodeString::truncate(this_00,(char *)(ulong)(iVar2 - 1),__length);
  if (other->filter != (UnicodeFilter *)0x0) {
    iVar2 = (*(other->filter->super_UnicodeFunctor).super_UObject._vptr_UObject[3])();
    this->filter = (UnicodeFilter *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

Transliterator::Transliterator(const Transliterator& other) :
    UObject(other), ID(other.ID), filter(0),
    maximumContextLength(other.maximumContextLength)
{
    // NUL-terminate the ID string, which is a non-aliased copy.
    ID.append((UChar)0);
    ID.truncate(ID.length()-1);

    if (other.filter != 0) {
        // We own the filter, so we must have our own copy
        filter = (UnicodeFilter*) other.filter->clone();
    }
}